

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O3

void __thiscall libsgp4::DateTime::FromTicks(DateTime *this,int *year,int *month,int *day)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined1 *puVar6;
  int iVar7;
  int iVar8;
  
  lVar3 = this->m_encoded / 86400000000;
  iVar8 = (int)((ulong)(lVar3 * 0x396b06bd) >> 0x20);
  iVar2 = (iVar8 >> 0xf) - (iVar8 >> 0x1f);
  iVar7 = iVar2 * -0x23ab1;
  iVar8 = (int)lVar3;
  iVar4 = iVar7 + iVar8;
  iVar5 = iVar4 / 0x8eac;
  if ((iVar8 + iVar7) - 0x23ab0U < 0x8eac) {
    iVar5 = 3;
  }
  iVar4 = iVar5 * -0x8eac + iVar4;
  iVar8 = (iVar4 % 0x5b5) / 0x16d;
  if (iVar4 % 0x5b5 - 0x5b4U < 0x16d) {
    iVar8 = 3;
  }
  iVar7 = iVar8 * -0x16d + iVar4 % 0x5b5;
  iVar8 = iVar8 + iVar5 * 100 + iVar2 * 400 + (iVar4 / 0x5b5) * 4 + 1;
  *year = iVar8;
  bVar1 = IsLeapYear(iVar8);
  puVar6 = (anonymous_namespace)::daysInMonth;
  if (bVar1) {
    puVar6 = (undefined1 *)0x10b494;
  }
  *month = 1;
  if (0x1e < iVar7) {
    iVar8 = 0x1f;
    lVar3 = 2;
    do {
      iVar7 = iVar7 - iVar8;
      *month = (int)lVar3;
      if (0xb < lVar3 - 1U) break;
      iVar8 = *(int *)(puVar6 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (iVar8 <= iVar7);
  }
  *day = iVar7 + 1;
  return;
}

Assistant:

void FromTicks(int& year, int& month, int& day) const
    {
        int totalDays = static_cast<int>(m_encoded / TicksPerDay);
        
        /*
         * number of 400 year cycles
         */
        int num400 = totalDays / 146097;
        totalDays -= num400 * 146097;
        /*
         * number of 100 year cycles
         */
        int num100 = totalDays / 36524;
        if (num100 == 4)
        {
            /*
             * last day of the last leap century
             */
            num100 = 3;
        }
        totalDays -= num100 * 36524;
        /*
         * number of 4 year cycles
         */
        int num4 = totalDays / 1461;
        totalDays -= num4 * 1461;
        /*
         * number of years
         */
        int num1 = totalDays / 365;
        if (num1 == 4)
        {
            /*
             * last day of the last leap olympiad
             */
            num1 = 3;
        }
        totalDays -= num1 * 365;

        /*
         * find year
         */
        year = (num400 * 400) + (num100 * 100) + (num4 * 4) + num1 + 1;
        
        /*
         * convert day of year to month/day
         */
        const int* daysInMonthPtr;
        if (IsLeapYear(year))
        {
            daysInMonthPtr = daysInMonth[1];
        }
        else
        {
            daysInMonthPtr = daysInMonth[0];
        }

        month = 1;
        while (totalDays >= daysInMonthPtr[month] && month <= 12)
        {
            totalDays -= daysInMonthPtr[month++];
        }

        day = totalDays + 1;
    }